

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001b2680 = 0x2d2d2d2d2d2d2d;
    uRam00000000001b2687 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001b2670 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001b2678 = 0x2d2d2d2d2d2d2d;
    DAT_001b267f = 0x2d;
    _DAT_001b2660 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001b2668 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001b2650 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001b2658 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001b2648 = 0x2d2d2d2d2d2d2d2d;
    DAT_001b268f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }